

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_ref_frames(AV1_COMMON *cm,MACROBLOCKD *xd,aom_writer *w)

{
  char cVar1;
  MB_MODE_INFO *mbmi_00;
  byte segment_id_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RDX;
  int nsymbs;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  int bit4;
  int bit3;
  int bit2_2;
  int bit1_2;
  int bit0;
  int bit_bwd;
  int bit2_1;
  int bit1_1;
  int bit;
  int bit2;
  int bit1;
  int bit_1;
  COMP_REFERENCE_TYPE comp_ref_type;
  uint8_t segment_id;
  int is_compound;
  MB_MODE_INFO *mbmi;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  int symb;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  
  nsymbs = (int)((ulong)in_RDX >> 0x20);
  symb = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x1eb8);
  iVar2 = has_second_ref(mbmi_00);
  segment_id_00 = (byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7;
  iVar3 = segfeature_active((segmentation *)(in_RDI + 19000),segment_id_00,'\x05');
  if (((iVar3 == 0) &&
      (iVar3 = segfeature_active((segmentation *)(in_RDI + 19000),segment_id_00,'\x06'), iVar3 == 0)
      ) && (iVar3 = segfeature_active((segmentation *)(in_RDI + 19000),segment_id_00,'\a'),
           iVar3 == 0)) {
    iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if ((*(char *)(in_RDI + 1) == '\x02') &&
       (iVar4 = is_comp_ref_allowed(mbmi_00->bsize), iVar4 != 0)) {
      av1_get_reference_mode_cdf
                ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       symb,(aom_cdf_prob *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
    }
    if (iVar2 == 0) {
      bVar6 = false;
      if (mbmi_00->ref_frame[0] < '\b') {
        bVar6 = '\x04' < mbmi_00->ref_frame[0];
      }
      av1_get_pred_cdf_single_ref_p1
                ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       symb,(aom_cdf_prob *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
      if (bVar6) {
        cVar1 = mbmi_00->ref_frame[0];
        av1_get_pred_cdf_single_ref_p2
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                         ,symb,(aom_cdf_prob *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        if (cVar1 != '\a') {
          av1_get_pred_cdf_single_ref_p6
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        }
      }
      else {
        bVar6 = true;
        if (mbmi_00->ref_frame[0] != '\x03') {
          bVar6 = mbmi_00->ref_frame[0] == '\x04';
        }
        av1_get_pred_cdf_single_ref_p3
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                         ,symb,(aom_cdf_prob *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        if (bVar6) {
          bVar6 = mbmi_00->ref_frame[0] != '\x03';
          uVar5 = (uint)bVar6;
          av1_get_pred_cdf_single_ref_p5
                    ((MACROBLOCKD *)(ulong)CONCAT14(bVar6,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)CONCAT44(uVar5,in_stack_fffffffffffffeb0),nsymbs);
        }
        else {
          uVar5 = (uint)(mbmi_00->ref_frame[0] != '\x01');
          av1_get_pred_cdf_single_ref_p4
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)CONCAT44(uVar5,in_stack_fffffffffffffec0),nsymbs,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        }
      }
    }
    else {
      iVar2 = has_uni_comp_refs((MB_MODE_INFO *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      av1_get_comp_reference_type_cdf
                ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       symb,(aom_cdf_prob *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
      if (iVar2 == 0) {
        bVar6 = true;
        if (mbmi_00->ref_frame[0] != '\x04') {
          bVar6 = mbmi_00->ref_frame[0] == '\x03';
        }
        av1_get_pred_cdf_comp_ref_p
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                         ,symb,(aom_cdf_prob *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        if (bVar6) {
          av1_get_pred_cdf_comp_ref_p2
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        }
        else {
          av1_get_pred_cdf_comp_ref_p1
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        }
        cVar1 = mbmi_00->ref_frame[1];
        av1_get_pred_cdf_comp_bwdref_p
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                         ,symb,(aom_cdf_prob *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        if (cVar1 != '\a') {
          av1_get_pred_cdf_comp_bwdref_p1
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        }
      }
      else {
        cVar1 = mbmi_00->ref_frame[0];
        av1_get_pred_cdf_uni_comp_ref_p
                  ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                         ,symb,(aom_cdf_prob *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
        if (cVar1 != '\x05') {
          bVar6 = true;
          if (mbmi_00->ref_frame[1] != '\x03') {
            bVar6 = mbmi_00->ref_frame[1] == '\x04';
          }
          av1_get_pred_cdf_uni_comp_ref_p1
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
          if (bVar6) {
            av1_get_pred_cdf_uni_comp_ref_p2
                      ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
            ;
            aom_write_symbol((aom_writer *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),symb,
                             (aom_cdf_prob *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_ref_frames(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                    aom_writer *w) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int is_compound = has_second_ref(mbmi);
  const uint8_t segment_id = mbmi->segment_id;

  // If segment level coding of this signal is disabled...
  // or the segment allows multiple reference frame options
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME)) {
    assert(!is_compound);
    assert(mbmi->ref_frame[0] ==
           get_segdata(&cm->seg, segment_id, SEG_LVL_REF_FRAME));
  } else if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP) ||
             segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
    assert(!is_compound);
    assert(mbmi->ref_frame[0] == LAST_FRAME);
  } else {
    // does the feature use compound prediction or not
    // (if not specified at the frame/segment level)
    if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
      if (is_comp_ref_allowed(mbmi->bsize))
        aom_write_symbol(w, is_compound, av1_get_reference_mode_cdf(xd), 2);
    } else {
      assert((!is_compound) ==
             (cm->current_frame.reference_mode == SINGLE_REFERENCE));
    }

    if (is_compound) {
      const COMP_REFERENCE_TYPE comp_ref_type = has_uni_comp_refs(mbmi)
                                                    ? UNIDIR_COMP_REFERENCE
                                                    : BIDIR_COMP_REFERENCE;
      aom_write_symbol(w, comp_ref_type, av1_get_comp_reference_type_cdf(xd),
                       2);

      if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
        const int bit = mbmi->ref_frame[0] == BWDREF_FRAME;
        WRITE_REF_BIT(bit, uni_comp_ref_p);

        if (!bit) {
          assert(mbmi->ref_frame[0] == LAST_FRAME);
          const int bit1 = mbmi->ref_frame[1] == LAST3_FRAME ||
                           mbmi->ref_frame[1] == GOLDEN_FRAME;
          WRITE_REF_BIT(bit1, uni_comp_ref_p1);
          if (bit1) {
            const int bit2 = mbmi->ref_frame[1] == GOLDEN_FRAME;
            WRITE_REF_BIT(bit2, uni_comp_ref_p2);
          }
        } else {
          assert(mbmi->ref_frame[1] == ALTREF_FRAME);
        }

        return;
      }

      assert(comp_ref_type == BIDIR_COMP_REFERENCE);

      const int bit = (mbmi->ref_frame[0] == GOLDEN_FRAME ||
                       mbmi->ref_frame[0] == LAST3_FRAME);
      WRITE_REF_BIT(bit, comp_ref_p);

      if (!bit) {
        const int bit1 = mbmi->ref_frame[0] == LAST2_FRAME;
        WRITE_REF_BIT(bit1, comp_ref_p1);
      } else {
        const int bit2 = mbmi->ref_frame[0] == GOLDEN_FRAME;
        WRITE_REF_BIT(bit2, comp_ref_p2);
      }

      const int bit_bwd = mbmi->ref_frame[1] == ALTREF_FRAME;
      WRITE_REF_BIT(bit_bwd, comp_bwdref_p);

      if (!bit_bwd) {
        WRITE_REF_BIT(mbmi->ref_frame[1] == ALTREF2_FRAME, comp_bwdref_p1);
      }

    } else {
      const int bit0 = (mbmi->ref_frame[0] <= ALTREF_FRAME &&
                        mbmi->ref_frame[0] >= BWDREF_FRAME);
      WRITE_REF_BIT(bit0, single_ref_p1);

      if (bit0) {
        const int bit1 = mbmi->ref_frame[0] == ALTREF_FRAME;
        WRITE_REF_BIT(bit1, single_ref_p2);

        if (!bit1) {
          WRITE_REF_BIT(mbmi->ref_frame[0] == ALTREF2_FRAME, single_ref_p6);
        }
      } else {
        const int bit2 = (mbmi->ref_frame[0] == LAST3_FRAME ||
                          mbmi->ref_frame[0] == GOLDEN_FRAME);
        WRITE_REF_BIT(bit2, single_ref_p3);

        if (!bit2) {
          const int bit3 = mbmi->ref_frame[0] != LAST_FRAME;
          WRITE_REF_BIT(bit3, single_ref_p4);
        } else {
          const int bit4 = mbmi->ref_frame[0] != LAST3_FRAME;
          WRITE_REF_BIT(bit4, single_ref_p5);
        }
      }
    }
  }
}